

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O3

int wally_addr_segwit_n_to_bytes
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              uchar *bytes_out,size_t len,size_t *written)

{
  char cVar1;
  size_t bytes_len;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uchar decoded [40];
  uint8_t data [84];
  uint8_t local_118 [48];
  char local_e8 [90];
  undefined1 auStack_8e [6];
  byte local_88;
  uint8_t local_87 [87];
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  if (len == 0) {
    return -2;
  }
  if (bytes_out == (uchar *)0x0) {
    return -2;
  }
  if (addr_len < 8) {
    return -2;
  }
  if (addr == (char *)0x0) {
    return -2;
  }
  if (addr_family_len == 0) {
    return -2;
  }
  if (addr_family == (char *)0x0) {
    return -2;
  }
  if (flags != 0) {
    return -2;
  }
  if (0xffffffffffffffac < addr_len - 0x5b) {
    pcVar6 = addr + -1;
    uVar10 = 0;
    do {
      uVar11 = uVar10;
      if (pcVar6[addr_len] == '1') break;
      uVar10 = uVar10 + 1;
      pcVar6 = pcVar6 + -1;
      uVar11 = addr_len;
    } while (addr_len != uVar10);
    uVar10 = addr_len - (uVar11 + 1);
    if (5 < uVar11 && (uVar11 + 1 <= addr_len && uVar10 != 0)) {
      lVar8 = uVar10 + (uVar10 == 0);
      bVar3 = false;
      bVar2 = false;
      uVar4 = 1;
      lVar12 = 0;
      do {
        cVar1 = addr[lVar12];
        uVar13 = (uint)cVar1;
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_0014c623;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar2 = true;
        }
        else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
          uVar13 = uVar13 | 0x20;
        }
        local_e8[lVar12] = (char)uVar13;
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = uVar13 >> 5 ^ uVar4;
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
      local_e8[lVar8] = '\0';
      uVar4 = bech32_polymod_step(uVar4);
      lVar12 = 0;
      do {
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = (byte)addr[lVar12] & 0x1f ^ uVar4;
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
      if (lVar8 + 1U < addr_len) {
        uVar9 = lVar8 + 7;
        do {
          cVar1 = addr[uVar9 - 6];
          if ((long)cVar1 < 0) {
            uVar13 = 0xffffffff;
          }
          else {
            uVar13 = (uint)charset_rev[cVar1];
          }
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar2 = true;
          }
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            bVar3 = true;
          }
          if (uVar13 == 0xffffffff) goto LAB_0014c623;
          uVar4 = bech32_polymod_step(uVar4);
          if (uVar9 < addr_len) {
            auStack_8e[uVar9 + ~uVar10] = (char)uVar13;
          }
          uVar4 = uVar4 ^ uVar13;
          lVar8 = (1 - addr_len) + uVar9;
          uVar9 = uVar9 + 1;
        } while (lVar8 != 6);
      }
      if ((!bVar2) || (!bVar3)) {
        if ((uVar11 - 7 < 0x41) &&
           (((uVar4 == 1 || uVar4 == 0x2bc830a3 &&
             (sVar7 = strlen(local_e8), sVar7 == addr_family_len)) &&
            (iVar5 = bcmp(local_e8,addr_family,addr_family_len), iVar5 == 0)))) {
          if (local_88 == 0) {
            if (uVar4 != 0x2bc830a3) goto LAB_0014c89c;
          }
          else if (local_88 < 0x11 && uVar4 == 0x2bc830a3) {
LAB_0014c89c:
            *written = 0;
            iVar5 = convert_bits(local_118,written,8,local_87,uVar11 - 7,5,0);
            if (((iVar5 != 0) && (bytes_len = *written, 0xffffffffffffffd8 < bytes_len - 0x29)) &&
               ((local_88 != 0 || ((bytes_len == 0x14 || (bytes_len == 0x20)))))) {
              iVar5 = wally_witness_program_from_bytes_and_version
                                (local_118,bytes_len,(uint)local_88,0,bytes_out,len,written);
              goto LAB_0014c656;
            }
          }
        }
      }
    }
  }
LAB_0014c623:
  wally_clear_2(&local_88,0x54,local_e8,0x54);
  *written = 0;
  iVar5 = -2;
LAB_0014c656:
  wally_clear(local_118,0x28);
  return iVar5;
}

Assistant:

int wally_addr_segwit_n_to_bytes(const char *addr, size_t addr_len,
                                 const char *addr_family, size_t addr_family_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char decoded[40];
    int ret;
    uint8_t witver;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr_family_len || !addr || addr_len < 8 || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr_family_len, addr, addr_len)) {
        *written = 0;
        ret = WALLY_EINVAL;
    } else {
        ret = wally_witness_program_from_bytes_and_version(
            decoded, *written, witver, flags, bytes_out, len, written);
    }

    wally_clear(decoded, sizeof(decoded));
    return ret;
}